

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbwindow.cpp
# Opt level: O0

void __thiscall QXcbWindow::hide(QXcbWindow *this)

{
  QPlatformScreen *pQVar1;
  bool bVar2;
  xcb_window_t xVar3;
  xcb_connection_t *pxVar4;
  xcb_connection_t *pxVar5;
  QXcbConnection *pQVar6;
  QXcbWindow *pQVar7;
  ulong uVar8;
  QXcbScreen *pQVar9;
  long *plVar10;
  QPlatformScreen **ppQVar11;
  QPoint *pQVar12;
  QXcbWindow *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  QWindow *childWindow;
  QPlatformScreen *screen;
  QList<QPlatformScreen_*> *__range2;
  QWindow *enterWindow;
  QPlatformWindow *w;
  QPoint localPos;
  QPoint devicePosition;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QPlatformScreen_*> screens;
  QPoint cursorPos;
  QPoint nativePos;
  q_padded_xcb_event<xcb_unmap_notify_event_t> event;
  QPoint *in_stack_fffffffffffffea0;
  QPointF *in_stack_fffffffffffffea8;
  QPoint *in_stack_fffffffffffffeb0;
  QPoint *p;
  QPoint *pQVar14;
  QPoint *local_108;
  QPoint *local_100;
  undefined1 local_e8 [16];
  QPoint local_d8;
  undefined1 local_d0 [16];
  undefined8 local_c0;
  QPoint local_b8;
  undefined1 local_b0 [16];
  QPlatformScreen **local_a0;
  const_iterator local_98;
  const_iterator local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  QPoint local_70;
  undefined8 local_68;
  undefined8 local_60;
  uint5 local_58;
  undefined3 uStack_53;
  undefined8 local_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pxVar4 = QXcbObject::xcb_connection((QXcbObject *)0x1e406c);
  xcb_unmap_window(pxVar4,in_RDI->m_window);
  _local_58 = 0;
  local_50 = 0xaaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaaaaaaaaaa;
  local_60 = 0x12;
  xcbScreen((QXcbWindow *)0x1e40ce);
  xVar3 = QXcbScreen::root((QXcbScreen *)0x1e40d6);
  local_60 = CONCAT44(xVar3,(undefined4)local_60);
  local_58 = (uint5)in_RDI->m_window;
  pxVar4 = QXcbObject::xcb_connection((QXcbObject *)0x1e40fd);
  xcbScreen((QXcbWindow *)0x1e410c);
  xVar3 = QXcbScreen::root((QXcbScreen *)0x1e4114);
  xcb_send_event(pxVar4,0,xVar3,0x180000,&local_60);
  pxVar5 = QXcbObject::xcb_connection((QXcbObject *)0x1e4141);
  xcb_flush(pxVar5);
  pQVar6 = QXcbObject::connection(&in_RDI->super_QXcbObject);
  pQVar7 = QXcbConnection::mouseGrabber((QXcbConnection *)pQVar6);
  if (pQVar7 == in_RDI) {
    pQVar6 = QXcbObject::connection(&in_RDI->super_QXcbObject);
    QXcbConnection::setMouseGrabber((QXcbConnection *)pQVar6,(QXcbWindow *)0x0);
  }
  pQVar6 = QXcbObject::connection(&in_RDI->super_QXcbObject);
  pQVar7 = QXcbConnection::mousePressWindow((QXcbConnection *)pQVar6);
  pQVar14 = (QPoint *)0x0;
  if (pQVar7 != (QXcbWindow *)0x0) {
    pQVar14 = (QPoint *)&pQVar7->super_QPlatformWindow;
  }
  local_100 = pQVar14;
  if (pQVar14 != (QPoint *)0x0) {
    while (local_100 != (QPoint *)0x0) {
      if (local_100 == (QPoint *)&in_RDI->super_QPlatformWindow) {
        pQVar6 = QXcbObject::connection(&in_RDI->super_QXcbObject);
        QXcbConnection::setMousePressWindow((QXcbConnection *)pQVar6,(QXcbWindow *)0x0);
        break;
      }
      local_100 = (QPoint *)QPlatformWindow::parent();
    }
  }
  in_RDI->m_mapped = false;
  QPlatformWindow::window();
  uVar8 = QWindow::isModal();
  if ((uVar8 & 1) != 0) {
    local_68 = 0xaaaaaaaaaaaaaaaa;
    pQVar9 = xcbScreen((QXcbWindow *)0x1e4256);
    plVar10 = (long *)(**(code **)(*(long *)pQVar9 + 0xb0))();
    local_68 = (**(code **)(*plVar10 + 0x80))();
    local_70.xp.m_i = -0x55555556;
    local_70.yp.m_i = -0x55555556;
    pQVar9 = xcbScreen((QXcbWindow *)0x1e428f);
    QPlatformScreen::screenForPosition((QPoint *)pQVar9);
    QPlatformScreen::screen();
    local_70 = QHighDpi::fromNativePixels<QPoint,QScreen>
                         (in_stack_fffffffffffffeb0,(QScreen *)in_stack_fffffffffffffea8);
    local_108 = (QPoint *)0x0;
    local_88 = 0xaaaaaaaaaaaaaaaa;
    local_80 = 0xaaaaaaaaaaaaaaaa;
    local_78 = 0xaaaaaaaaaaaaaaaa;
    pQVar9 = xcbScreen((QXcbWindow *)0x1e42ff);
    (**(code **)(*(long *)pQVar9 + 0x88))(&local_88);
    local_90.i = (QPlatformScreen **)0xaaaaaaaaaaaaaaaa;
    local_90 = QList<QPlatformScreen_*>::begin
                         ((QList<QPlatformScreen_*> *)in_stack_fffffffffffffea8);
    local_98.i = (QPlatformScreen **)0xaaaaaaaaaaaaaaaa;
    local_98 = QList<QPlatformScreen_*>::end((QList<QPlatformScreen_*> *)in_stack_fffffffffffffea8);
    while( true ) {
      local_a0 = local_98.i;
      bVar2 = QList<QPlatformScreen_*>::const_iterator::operator!=(&local_90,local_98);
      if (!bVar2) break;
      ppQVar11 = QList<QPlatformScreen_*>::const_iterator::operator*(&local_90);
      pQVar1 = *ppQVar11;
      auVar13 = (**(code **)(*(long *)pQVar1 + 0x20))();
      local_b0 = auVar13;
      uVar8 = QRect::contains((QPoint *)local_b0,SUB81(&local_70,0));
      if ((uVar8 & 1) != 0) {
        local_b8.xp.m_i = -0x55555556;
        local_b8.yp.m_i = -0x55555556;
        QPlatformScreen::screen();
        local_b8 = QHighDpi::toNativePixels<QPoint,QScreen>
                             (in_stack_fffffffffffffeb0,(QScreen *)in_stack_fffffffffffffea8);
        local_108 = (QPoint *)(**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&local_b8);
        break;
      }
      QList<QPlatformScreen_*>::const_iterator::operator++(&local_90);
    }
    if (local_108 != (QPoint *)0x0) {
      p = local_108;
      pQVar12 = (QPoint *)QPlatformWindow::window();
      if (p != pQVar12) {
        pQVar14 = (QPoint *)childWindowAt((QWindow *)pxVar4,pQVar14);
        if (pQVar14 != (QPoint *)0x0) {
          local_108 = pQVar14;
        }
        local_c0 = 0xaaaaaaaaaaaaaaaa;
        local_c0 = QWindow::mapFromGlobal((QPoint *)local_108);
        QHighDpiScaling::factor<QWindow>((QWindow *)pQVar7);
        local_d8 = ::operator*(p,(double)local_108);
        QPointF::QPointF(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        QPointF::QPointF(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        QWindowSystemInterface::handleEnterEvent<QWindowSystemInterface::DefaultDelivery>
                  ((QWindow *)local_108,(QPointF *)local_d0,(QPointF *)local_e8);
      }
    }
    QList<QPlatformScreen_*>::~QList((QList<QPlatformScreen_*> *)0x1e4549);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXcbWindow::hide()
{
    xcb_unmap_window(xcb_connection(), m_window);

    // send synthetic UnmapNotify event according to icccm 4.1.4
    q_padded_xcb_event<xcb_unmap_notify_event_t> event = {};
    event.response_type = XCB_UNMAP_NOTIFY;
    event.event = xcbScreen()->root();
    event.window = m_window;
    event.from_configure = false;
    xcb_send_event(xcb_connection(), false, xcbScreen()->root(),
                   XCB_EVENT_MASK_SUBSTRUCTURE_NOTIFY | XCB_EVENT_MASK_SUBSTRUCTURE_REDIRECT, (const char *)&event);

    xcb_flush(xcb_connection());

    if (connection()->mouseGrabber() == this)
        connection()->setMouseGrabber(nullptr);
    if (QPlatformWindow *w = connection()->mousePressWindow()) {
        // Unset mousePressWindow when it (or one of its parents) is unmapped
        while (w) {
            if (w == this) {
                connection()->setMousePressWindow(nullptr);
                break;
            }
            w = w->parent();
        }
    }

    m_mapped = false;

    // Hiding a modal window doesn't send an enter event to its transient parent when the
    // mouse is already over the parent window, so the enter event must be emulated.
    if (window()->isModal()) {
        // Get the cursor position at modal window screen
        const QPoint nativePos = xcbScreen()->cursor()->pos();
        const QPoint cursorPos = QHighDpi::fromNativePixels(nativePos, xcbScreen()->screenForPosition(nativePos)->screen());

        // Find the top level window at cursor position.
        // Don't use QGuiApplication::topLevelAt(): search only the virtual siblings of this window's screen
        QWindow *enterWindow = nullptr;
        const auto screens = xcbScreen()->virtualSiblings();
        for (QPlatformScreen *screen : screens) {
            if (screen->geometry().contains(cursorPos)) {
                const QPoint devicePosition = QHighDpi::toNativePixels(cursorPos, screen->screen());
                enterWindow = screen->topLevelAt(devicePosition);
                break;
            }
        }

        if (enterWindow && enterWindow != window()) {
            // Find the child window at cursor position, otherwise use the top level window
            if (QWindow *childWindow = childWindowAt(enterWindow, cursorPos))
                enterWindow = childWindow;
            const QPoint localPos = enterWindow->mapFromGlobal(cursorPos);
            QWindowSystemInterface::handleEnterEvent(enterWindow,
                                                     localPos * QHighDpiScaling::factor(enterWindow),
                                                     nativePos);
        }
    }
}